

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinePaintScheme.h
# Opt level: O0

MinePaintScheme * __thiscall
KDIS::DATA_TYPE::MinePaintScheme::operator=(MinePaintScheme *this,MinePaintScheme *param_1)

{
  MinePaintScheme *param_1_local;
  MinePaintScheme *this_local;
  
  DataTypeBase::operator=(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  this->m_PntScmUnion = param_1->m_PntScmUnion;
  return this;
}

Assistant:

class KDIS_EXPORT MinePaintScheme : public DataTypeBase
{
protected:

    union
    {
        struct
        {
            KUINT8 m_ui8Alg : 2;
            KUINT8 m_ui8Scm : 6;
        };

        KUINT8 m_ui8PntSchm;
    } m_PntScmUnion;

public:

    static const KUINT16 MINE_PAINT_SCHEME_SIZE = 1;

    MinePaintScheme();

    MinePaintScheme( KDIS::DATA_TYPE::ENUMS::MineAlgae A, KDIS::DATA_TYPE::ENUMS::PaintScheme PS );

    MinePaintScheme(KDataStream &stream) noexcept(false);

    virtual ~MinePaintScheme();

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinePaintScheme::SetAlgae
    //              KDIS::DATA_TYPE::MinePaintScheme::GetAlgae
    // Description: The algae build-up on the mine.
    // Parameter:   MineAlgae A
    //************************************
    void SetAlgae( KDIS::DATA_TYPE::ENUMS::MineAlgae A );
    KDIS::DATA_TYPE::ENUMS::MineAlgae GetAlgae() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinePaintScheme::SetPaintScheme
    //              KDIS::DATA_TYPE::MinePaintScheme::GetPaintScheme
    // Description: The paint scheme of the mine.
    // Parameter:   PaintScheme PS
    //************************************
    void SetPaintScheme( KDIS::DATA_TYPE::ENUMS::PaintScheme PS );
    KDIS::DATA_TYPE::ENUMS::PaintScheme GetPaintScheme() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinePaintScheme::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinePaintScheme::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::MinePaintScheme::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const MinePaintScheme & Value ) const;
    KBOOL operator != ( const MinePaintScheme & Value ) const;
}